

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O1

void arg_print_syntax(FILE *fp,void **argtable,char *suffix)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  undefined1 *puVar4;
  long lVar5;
  void *pvVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  void **ppvVar11;
  undefined1 *puVar12;
  char *pcVar13;
  long lVar14;
  char syntax [200];
  char local_10b [3];
  char *local_108;
  long local_100;
  char local_f8 [200];
  
  pbVar3 = (byte *)*argtable;
  local_108 = suffix;
  if (pbVar3 == (byte *)0x0) {
    pcVar13 = " [-%c";
  }
  else {
    ppvVar11 = argtable + 1;
    pcVar2 = " -%c";
    pcVar13 = " [-%c";
    do {
      if ((*pbVar3 & 1) != 0) break;
      if ((0 < *(int *)(pbVar3 + 0x28)) &&
         ((char)((*pbVar3 & 2) >> 1) == '\0' && *(char **)(pbVar3 + 8) != (char *)0x0)) {
        fprintf((FILE *)fp,pcVar2,(ulong)(uint)(int)**(char **)(pbVar3 + 8));
        pcVar2 = "%c";
        pcVar13 = "[%c";
      }
      pbVar3 = (byte *)*ppvVar11;
      ppvVar11 = ppvVar11 + 1;
    } while (pbVar3 != (byte *)0x0);
  }
  pbVar3 = (byte *)*argtable;
  if (pbVar3 == (byte *)0x0) {
    pcVar2 = "";
  }
  else {
    ppvVar11 = argtable + 1;
    pcVar2 = "";
    do {
      if ((*pbVar3 & 1) != 0) break;
      if ((*(int *)(pbVar3 + 0x28) < 1) &&
         ((char)((*pbVar3 & 2) >> 1) == '\0' && *(char **)(pbVar3 + 8) != (char *)0x0)) {
        fprintf((FILE *)fp,pcVar13,(ulong)(uint)(int)**(char **)(pbVar3 + 8));
        pcVar13 = "%c";
        pcVar2 = "]";
      }
      pbVar3 = (byte *)*ppvVar11;
      ppvVar11 = ppvVar11 + 1;
    } while (pbVar3 != (byte *)0x0);
  }
  fputs(pcVar2,(FILE *)fp);
  pbVar3 = (byte *)*argtable;
  if (pbVar3 != (byte *)0x0) {
    lVar14 = 0;
    do {
      if ((*pbVar3 & 1) != 0) break;
      memset(local_f8,0,200);
      puVar4 = *(undefined1 **)(pbVar3 + 8);
      if ((puVar4 == (undefined1 *)0x0) || ((*pbVar3 & 2) != 0)) {
        lVar5 = *(long *)(pbVar3 + 0x18);
        bVar1 = *pbVar3;
        if (puVar4 == (undefined1 *)0x0) {
          pcVar13 = *(char **)(pbVar3 + 0x10);
          if (pcVar13 == (char *)0x0) {
            if (lVar5 != 0) {
              uVar8 = 0;
              if ((bVar1 & 4) == 0) {
                do {
                  if (local_f8[uVar8] == '\0') goto LAB_00107e8a;
                  uVar8 = uVar8 + 1;
                } while (uVar8 != 200);
                uVar8 = 200;
LAB_00107e8a:
                pcVar13 = local_f8 + uVar8;
                pcVar2 = pcVar13;
                if (uVar8 < 200) {
                  lVar9 = 0;
                  do {
                    if (*(char *)(lVar5 + lVar9) == '\0') goto LAB_00107e4a;
                    pcVar13[lVar9] = *(char *)(lVar5 + lVar9);
                    lVar9 = lVar9 + 1;
                    pcVar2 = &stack0xffffffffffffffd0;
                  } while (200 - uVar8 != lVar9);
                }
              }
              else {
                do {
                  if (local_f8[uVar8] == '\0') goto LAB_00108044;
                  uVar8 = uVar8 + 1;
                } while (uVar8 != 200);
                uVar8 = 200;
LAB_00108044:
                pcVar13 = local_f8 + uVar8;
                if (uVar8 < 200) {
                  lVar9 = 0;
                  do {
                    if (lVar9 == 1) break;
                    pcVar13[lVar9] = "["[lVar9];
                    lVar9 = lVar9 + 1;
                  } while (200 - uVar8 != lVar9);
                  pcVar13 = pcVar13 + lVar9;
                }
                *pcVar13 = '\0';
                if (&stack0xffffffffffffffd0 != pcVar13 &&
                    -1 < (long)&stack0xffffffffffffffd0 - (long)pcVar13) {
                  do {
                    if (*pcVar13 == '\0') break;
                    pcVar13 = pcVar13 + 1;
                  } while (pcVar13 < &stack0xffffffffffffffd0);
                }
                if (pcVar13 < &stack0xffffffffffffffd0) {
                  lVar9 = 0;
                  do {
                    if (*(char *)(lVar5 + lVar9) == '\0') break;
                    pcVar13[lVar9] = *(char *)(lVar5 + lVar9);
                    lVar9 = lVar9 + 1;
                  } while ((long)&stack0xffffffffffffffd0 - (long)pcVar13 != lVar9);
                  pcVar13 = pcVar13 + lVar9;
                }
                *pcVar13 = '\0';
                if (0 < (long)&stack0xffffffffffffffd0 - (long)pcVar13) {
                  do {
                    if (*pcVar13 == '\0') break;
                    pcVar13 = pcVar13 + 1;
                  } while (pcVar13 < &stack0xffffffffffffffd0);
                }
                pcVar2 = pcVar13;
                if (pcVar13 < &stack0xffffffffffffffd0) {
                  lVar9 = 0;
                  do {
                    if (lVar9 == 1) break;
                    pcVar13[lVar9] = " [%s] [%s]"[lVar9 + 9];
                    lVar9 = lVar9 + 1;
                  } while ((long)&stack0xffffffffffffffd0 - (long)pcVar13 != lVar9);
                  goto LAB_00107e4a;
                }
              }
              goto LAB_00107e4d;
            }
          }
          else {
            uVar8 = 0;
            do {
              if (local_f8[uVar8] == '\0') goto LAB_00107bb6;
              uVar8 = uVar8 + 1;
            } while (uVar8 != 200);
            uVar8 = 200;
LAB_00107bb6:
            pcVar2 = local_f8 + uVar8;
            if (uVar8 < 200) {
              lVar9 = 0;
              do {
                if (lVar9 == 2) break;
                pcVar2[lVar9] = "--"[lVar9];
                lVar9 = lVar9 + 1;
              } while (200 - uVar8 != lVar9);
              pcVar2 = pcVar2 + lVar9;
            }
            *pcVar2 = '\0';
            puVar12 = &stack0xffffffffffffffd0 + -(long)pcVar2;
            local_100 = lVar5;
            puVar4 = (undefined1 *)strcspn(pcVar13,",");
            if (puVar12 <= puVar4) {
              puVar4 = puVar12;
            }
            strncat(pcVar2,pcVar13,(size_t)puVar4);
            if (local_100 != 0) {
              pcVar13 = pcVar2 + (long)puVar12;
              if (0 < (long)puVar12) {
                do {
                  if (*pcVar2 == '\0') break;
                  pcVar2 = pcVar2 + 1;
                } while (pcVar2 < pcVar13);
              }
              if (pcVar2 < pcVar13) {
                lVar5 = 0;
                do {
                  if (lVar5 == 1) break;
                  pcVar2[lVar5] = "%sReturn. Stack="[lVar5 + 0xf];
                  lVar5 = lVar5 + 1;
                } while ((long)&stack0xffffffffffffffd0 - (long)pcVar2 != lVar5);
                pcVar2 = pcVar2 + lVar5;
              }
              *pcVar2 = '\0';
              lVar5 = (long)&stack0xffffffffffffffd0 - (long)pcVar2;
              if ((bVar1 & 4) == 0) {
                if (0 < lVar5) {
                  do {
                    if (*pcVar2 == '\0') break;
                    pcVar2 = pcVar2 + 1;
                  } while (pcVar2 < &stack0xffffffffffffffd0);
                }
                if (pcVar2 < &stack0xffffffffffffffd0) {
                  lVar5 = 0;
                  do {
                    if (*(char *)(local_100 + lVar5) == '\0') break;
                    pcVar2[lVar5] = *(char *)(local_100 + lVar5);
                    lVar5 = lVar5 + 1;
                  } while ((long)&stack0xffffffffffffffd0 - (long)pcVar2 != lVar5);
LAB_00107f86:
                  pcVar2 = pcVar2 + lVar5;
                }
              }
              else {
                if (&stack0xffffffffffffffd0 != pcVar2 && -1 < lVar5) {
                  do {
                    if (*pcVar2 == '\0') break;
                    pcVar2 = pcVar2 + 1;
                  } while (pcVar2 < &stack0xffffffffffffffd0);
                }
                if (pcVar2 < &stack0xffffffffffffffd0) {
                  lVar5 = 0;
                  do {
                    if (lVar5 == 1) break;
                    pcVar2[lVar5] = "["[lVar5];
                    lVar5 = lVar5 + 1;
                  } while ((long)&stack0xffffffffffffffd0 - (long)pcVar2 != lVar5);
                  pcVar2 = pcVar2 + lVar5;
                }
                *pcVar2 = '\0';
                if (&stack0xffffffffffffffd0 != pcVar2 &&
                    -1 < (long)&stack0xffffffffffffffd0 - (long)pcVar2) {
                  do {
                    if (*pcVar2 == '\0') break;
                    pcVar2 = pcVar2 + 1;
                  } while (pcVar2 < &stack0xffffffffffffffd0);
                }
                if (pcVar2 < &stack0xffffffffffffffd0) {
                  lVar5 = 0;
                  do {
                    if (*(char *)(local_100 + lVar5) == '\0') break;
                    pcVar2[lVar5] = *(char *)(local_100 + lVar5);
                    lVar5 = lVar5 + 1;
                  } while ((long)&stack0xffffffffffffffd0 - (long)pcVar2 != lVar5);
                  pcVar2 = pcVar2 + lVar5;
                }
                *pcVar2 = '\0';
                if (&stack0xffffffffffffffd0 != pcVar2 &&
                    -1 < (long)&stack0xffffffffffffffd0 - (long)pcVar2) {
                  do {
                    if (*pcVar2 == '\0') break;
                    pcVar2 = pcVar2 + 1;
                  } while (pcVar2 < &stack0xffffffffffffffd0);
                }
                if (pcVar2 < &stack0xffffffffffffffd0) {
                  lVar5 = 0;
                  do {
                    if (lVar5 == 1) break;
                    pcVar2[lVar5] = " [%s] [%s]"[lVar5 + 9];
                    lVar5 = lVar5 + 1;
                  } while ((long)&stack0xffffffffffffffd0 - (long)pcVar2 != lVar5);
                  goto LAB_00107f86;
                }
              }
              *pcVar2 = '\0';
            }
          }
        }
        else {
          local_10b[0] = '-';
          local_10b[1] = *puVar4;
          local_10b[2] = 0;
          uVar8 = 0;
          do {
            if (local_f8[uVar8] == '\0') goto LAB_00107b48;
            uVar8 = uVar8 + 1;
          } while (uVar8 != 200);
          uVar8 = 200;
LAB_00107b48:
          pcVar2 = local_f8 + uVar8;
          pcVar13 = pcVar2;
          if (uVar8 < 200) {
            lVar9 = 0;
            do {
              if (local_10b[lVar9] == '\0') {
                pcVar13 = pcVar2 + lVar9;
                break;
              }
              pcVar2[lVar9] = local_10b[lVar9];
              lVar9 = lVar9 + 1;
              pcVar13 = &stack0xffffffffffffffd0;
            } while (200 - uVar8 != lVar9);
          }
          *pcVar13 = '\0';
          if (lVar5 != 0) {
            if (&stack0xffffffffffffffd0 != pcVar13 &&
                -1 < (long)&stack0xffffffffffffffd0 - (long)pcVar13) {
              do {
                if (*pcVar13 == '\0') break;
                pcVar13 = pcVar13 + 1;
              } while (pcVar13 < &stack0xffffffffffffffd0);
            }
            if (pcVar13 < &stack0xffffffffffffffd0) {
              lVar9 = 0;
              do {
                if (lVar9 == 1) break;
                pcVar13[lVar9] = "illegal value  "[lVar9 + 0xe];
                lVar9 = lVar9 + 1;
              } while ((long)&stack0xffffffffffffffd0 - (long)pcVar13 != lVar9);
              pcVar13 = pcVar13 + lVar9;
            }
            *pcVar13 = '\0';
            lVar9 = (long)&stack0xffffffffffffffd0 - (long)pcVar13;
            if ((bVar1 & 4) == 0) {
              if (0 < lVar9) {
                do {
                  if (*pcVar13 == '\0') break;
                  pcVar13 = pcVar13 + 1;
                } while (pcVar13 < &stack0xffffffffffffffd0);
              }
              pcVar2 = pcVar13;
              if (pcVar13 < &stack0xffffffffffffffd0) {
                lVar9 = 0;
                do {
                  if (*(char *)(lVar5 + lVar9) == '\0') break;
                  pcVar13[lVar9] = *(char *)(lVar5 + lVar9);
                  lVar9 = lVar9 + 1;
                } while ((long)&stack0xffffffffffffffd0 - (long)pcVar13 != lVar9);
LAB_00107e4a:
                pcVar2 = pcVar13 + lVar9;
              }
            }
            else {
              if (0 < lVar9) {
                do {
                  if (*pcVar13 == '\0') break;
                  pcVar13 = pcVar13 + 1;
                } while (pcVar13 < &stack0xffffffffffffffd0);
              }
              if (pcVar13 < &stack0xffffffffffffffd0) {
                lVar9 = 0;
                do {
                  if (lVar9 == 1) break;
                  pcVar13[lVar9] = "["[lVar9];
                  lVar9 = lVar9 + 1;
                } while ((long)&stack0xffffffffffffffd0 - (long)pcVar13 != lVar9);
                pcVar13 = pcVar13 + lVar9;
              }
              *pcVar13 = '\0';
              if (&stack0xffffffffffffffd0 != pcVar13 &&
                  -1 < (long)&stack0xffffffffffffffd0 - (long)pcVar13) {
                do {
                  if (*pcVar13 == '\0') break;
                  pcVar13 = pcVar13 + 1;
                } while (pcVar13 < &stack0xffffffffffffffd0);
              }
              if (pcVar13 < &stack0xffffffffffffffd0) {
                lVar9 = 0;
                do {
                  if (*(char *)(lVar5 + lVar9) == '\0') break;
                  pcVar13[lVar9] = *(char *)(lVar5 + lVar9);
                  lVar9 = lVar9 + 1;
                } while ((long)&stack0xffffffffffffffd0 - (long)pcVar13 != lVar9);
                pcVar13 = pcVar13 + lVar9;
              }
              *pcVar13 = '\0';
              if (0 < (long)&stack0xffffffffffffffd0 - (long)pcVar13) {
                do {
                  if (*pcVar13 == '\0') break;
                  pcVar13 = pcVar13 + 1;
                } while (pcVar13 < &stack0xffffffffffffffd0);
              }
              pcVar2 = pcVar13;
              if (pcVar13 < &stack0xffffffffffffffd0) {
                lVar9 = 0;
                do {
                  if (lVar9 == 1) break;
                  pcVar13[lVar9] = " [%s] [%s]"[lVar9 + 9];
                  lVar9 = lVar9 + 1;
                } while ((long)&stack0xffffffffffffffd0 - (long)pcVar13 != lVar9);
                goto LAB_00107e4a;
              }
            }
LAB_00107e4d:
            *pcVar2 = '\0';
          }
        }
        if (local_f8[0] != '\0') {
          pvVar6 = argtable[lVar14];
          iVar7 = *(int *)((long)pvVar6 + 0x28);
          if (0 < iVar7) {
            iVar10 = 0;
            do {
              fprintf((FILE *)fp," %s",local_f8);
              iVar10 = iVar10 + 1;
              pvVar6 = argtable[lVar14];
              iVar7 = *(int *)((long)pvVar6 + 0x28);
            } while (iVar10 < iVar7);
          }
          iVar10 = *(int *)((long)pvVar6 + 0x2c) - iVar7;
          if (*(int *)((long)pvVar6 + 0x2c) != iVar7) {
            if (iVar10 == 2) {
              fprintf((FILE *)fp," [%s] [%s]",local_f8);
            }
            else {
              if (iVar10 == 1) {
                pcVar13 = " [%s]";
              }
              else {
                pcVar13 = " [%s]...";
              }
              fprintf((FILE *)fp,pcVar13,local_f8);
            }
          }
        }
      }
      pbVar3 = (byte *)argtable[lVar14 + 1];
      lVar14 = lVar14 + 1;
    } while (pbVar3 != (byte *)0x0);
  }
  if (local_108 != (char *)0x0) {
    fputs(local_108,(FILE *)fp);
  }
  return;
}

Assistant:

void arg_print_syntax(FILE * fp, void * *argtable, const char * suffix) {
	struct arg_hdr * *table = (struct arg_hdr * *)argtable;
	int i, tabindex;

	/* print GNU style [OPTION] string */
	arg_print_gnuswitch(fp, table);

	/* print remaining options in abbreviated style */
	for (tabindex = 0;
			table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR);
			tabindex++) {
		char syntax[200] = "";
		const char * shortopts, *longopts, *datatype;

		/* skip short options without arg values (they were printed by arg_print_gnu_switch) */
		if (table[tabindex]->shortopts &&
				!(table[tabindex]->flag & ARG_HASVALUE)) {
			continue;
		}

		shortopts = table[tabindex]->shortopts;
		longopts  = table[tabindex]->longopts;
		datatype  = table[tabindex]->datatype;
		arg_cat_option(syntax,
					   sizeof(syntax),
					   shortopts,
					   longopts,
					   datatype,
					   table[tabindex]->flag & ARG_HASOPTVALUE);

		if (strlen(syntax) > 0) {
			/* print mandatory instances of this option */
			for (i = 0; i < table[tabindex]->mincount; i++) {
				fprintf(fp, " %s", syntax);
			}

			/* print optional instances enclosed in "[..]" */
			switch ( table[tabindex]->maxcount - table[tabindex]->mincount ) {
				case 0:
					break;

				case 1:
					fprintf(fp, " [%s]", syntax);
					break;

				case 2:
					fprintf(fp, " [%s] [%s]", syntax, syntax);
					break;

				default:
					fprintf(fp, " [%s]...", syntax);
					break;
			}
		}
	}

	if (suffix) {
		fprintf(fp, "%s", suffix);
	}
}